

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,FunctionName *func_name,void *data)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *pvVar4;
  undefined4 *in_RDX;
  String *in_RSI;
  Function *in_RDI;
  TokenDetail *token;
  int line;
  String *name;
  size_t i;
  anon_class_16_2_8524b8c4 load_key;
  int key_register;
  size_type count;
  size_type size;
  bool member;
  LocalNameInfo *local_name_1;
  int index_3;
  int index_2;
  int table_register;
  Instruction instruction_1;
  LocalNameInfo *local_name;
  int index_1;
  int index;
  Instruction instruction;
  int first_line;
  String *first_name;
  bool has_member;
  Function *function;
  int func_register;
  String *in_stack_fffffffffffffef8;
  CodeGenerateVisitor *in_stack_ffffffffffffff00;
  int iVar5;
  vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *this_00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 uVar6;
  Instruction IVar7;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *local_c0;
  Instruction local_64;
  uint local_60;
  uint local_5c;
  LocalNameInfo *local_58;
  uint local_50;
  int local_4c;
  uint local_48;
  int local_44;
  Instruction local_40;
  int local_3c;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_38;
  byte local_29;
  Function *local_28;
  undefined4 local_1c;
  undefined4 *local_18;
  Function *this_01;
  
  local_18 = in_RDX;
  this_01 = in_RDI;
  bVar1 = std::vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>::empty
                    ((vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)in_RDI);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!func_name->names_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                  ,0x3ff,"virtual void luna::CodeGenerateVisitor::Visit(FunctionName *, void *)");
  }
  local_1c = *local_18;
  local_28 = GetCurrentFunction((CodeGenerateVisitor *)in_RDI);
  sVar2 = std::vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>::size
                    ((vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)
                     &(in_RSI->super_GCObject).next_);
  uVar6 = true;
  if (sVar2 < 2) {
    uVar6 = *(int *)&in_RSI[1].super_GCObject._vptr_GCObject == 0x115;
  }
  local_29 = uVar6;
  pvVar3 = std::vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>::operator[]
                     ((vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)
                      &(in_RSI->super_GCObject).next_,0);
  local_38 = pvVar3->field_0;
  pvVar3 = std::vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>::operator[]
                     ((vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)
                      &(in_RSI->super_GCObject).next_,0);
  local_3c = pvVar3->line_;
  if ((local_29 & 1) == 0) {
    sVar2 = std::vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>::size
                      ((vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)
                       &(in_RSI->super_GCObject).next_);
    if (sVar2 != 1) {
      __assert_fail("func_name->names_.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                    ,0x40b,"virtual void luna::CodeGenerateVisitor::Visit(FunctionName *, void *)");
    }
    Instruction::Instruction(&local_40);
    if (*(int *)&in_RSI[1].super_GCObject.next_ == 1) {
      local_44 = Function::AddConstString
                           (in_RDI,(String *)CONCAT17(uVar6,in_stack_ffffffffffffff08));
      IVar7.opcode_ = (uint)((ulong)in_RDI >> 0x20);
      local_48 = (uint)Instruction::ABxCode
                                 ((OpType)in_stack_ffffffffffffff00,
                                  (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                                  (int)in_stack_fffffffffffffef8);
      iVar5 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
      local_40 = (Instruction)local_48;
    }
    else if (*(int *)&in_RSI[1].super_GCObject.next_ == 2) {
      local_4c = PrepareUpvalue((CodeGenerateVisitor *)this_01,in_RSI);
      IVar7.opcode_ = (uint)((ulong)in_RDI >> 0x20);
      local_50 = (uint)Instruction::ABCode((OpType)in_stack_ffffffffffffff00,
                                           (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                                           (int)in_stack_fffffffffffffef8);
      iVar5 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
      local_40 = (Instruction)local_50;
    }
    else {
      if (*(int *)&in_RSI[1].super_GCObject.next_ == 3) {
        local_58 = SearchLocalName(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        local_5c = (uint)Instruction::ABCode((OpType)in_stack_ffffffffffffff00,
                                             (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                                             (int)in_stack_fffffffffffffef8);
        local_40 = (Instruction)local_5c;
      }
      IVar7.opcode_ = (uint)((ulong)in_RDI >> 0x20);
      iVar5 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
    }
    local_60 = local_40.opcode_;
    Function::AddInstruction((Function *)CONCAT17(uVar6,in_stack_ffffffffffffff08),IVar7,iVar5);
  }
  else {
    Instruction::Instruction(&local_64);
    GenerateRegisterId((CodeGenerateVisitor *)
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    if (*(int *)&in_RSI[1].super_GCObject.next_ == 1) {
      Function::AddConstString(in_RDI,(String *)CONCAT17(uVar6,in_stack_ffffffffffffff08));
      local_64 = Instruction::ABxCode
                           ((OpType)in_stack_ffffffffffffff00,
                            (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                            (int)in_stack_fffffffffffffef8);
      iVar5 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
    }
    else if (*(int *)&in_RSI[1].super_GCObject.next_ == 2) {
      PrepareUpvalue((CodeGenerateVisitor *)this_01,in_RSI);
      local_64 = Instruction::ABCode((OpType)in_stack_ffffffffffffff00,
                                     (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                                     (int)in_stack_fffffffffffffef8);
      iVar5 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
    }
    else {
      if (*(int *)&in_RSI[1].super_GCObject.next_ == 3) {
        SearchLocalName(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        local_64 = Instruction::ABCode((OpType)in_stack_ffffffffffffff00,
                                       (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                                       (int)in_stack_fffffffffffffef8);
      }
      iVar5 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
    }
    Function::AddInstruction
              ((Function *)CONCAT17(uVar6,in_stack_ffffffffffffff08),
               (Instruction)(uint)((ulong)in_RDI >> 0x20),iVar5);
    bVar1 = *(int *)&in_RSI[1].super_GCObject._vptr_GCObject != 0x115;
    pvVar4 = (vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)
             std::vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>::size
                       ((vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)
                        &(in_RSI->super_GCObject).next_);
    if (bVar1) {
      pvVar4 = (vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)
               ((long)&pvVar4[-1].
                       super__Vector_base<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    }
    this_00 = pvVar4;
    GenerateRegisterId((CodeGenerateVisitor *)
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    for (local_c0 = (vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)0x1;
        local_c0 < pvVar4;
        local_c0 = (vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)
                   ((long)&(local_c0->
                           super__Vector_base<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1)) {
      std::vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>::operator[]
                ((vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)
                 &(in_RSI->super_GCObject).next_,(size_type)local_c0);
      std::vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>::operator[]
                ((vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)
                 &(in_RSI->super_GCObject).next_,(size_type)local_c0);
      Visit::anon_class_16_2_8524b8c4::operator()
                ((anon_class_16_2_8524b8c4 *)in_RDI,
                 (String *)CONCAT17(uVar6,in_stack_ffffffffffffff08),(int)((ulong)this_00 >> 0x20));
      local_64 = Instruction::ABCCode
                           ((OpType)this_00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                            (int)in_stack_fffffffffffffef8,0);
      Function::AddInstruction
                ((Function *)CONCAT17(uVar6,in_stack_ffffffffffffff08),
                 (Instruction)(uint)((ulong)in_RDI >> 0x20),(int)((ulong)this_00 >> 0x20));
    }
    if (bVar1) {
      pvVar3 = std::vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>::back(this_00);
    }
    else {
      pvVar3 = (reference)(&(in_RSI->field_1).str_ + 1);
    }
    Visit::anon_class_16_2_8524b8c4::operator()
              ((anon_class_16_2_8524b8c4 *)in_RDI,
               (String *)CONCAT17(uVar6,in_stack_ffffffffffffff08),(int)((ulong)this_00 >> 0x20));
    IVar7.opcode_ = (uint)((ulong)in_RDI >> 0x20);
    local_64 = Instruction::ABCCode((OpType)this_00,(int)((ulong)pvVar3 >> 0x20),(int)pvVar3,0);
    Function::AddInstruction
              ((Function *)CONCAT17(uVar6,in_stack_ffffffffffffff08),IVar7,
               (int)((ulong)this_00 >> 0x20));
  }
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(FunctionName *func_name, void *data)
    {
        assert(!func_name->names_.empty());
        auto func_register = static_cast<FunctionNameData *>(data)->func_register_;
        auto function = GetCurrentFunction();

        bool has_member = func_name->names_.size() > 1 ||
            func_name->member_name_.token_ == Token_Id;

        auto first_name = func_name->names_[0].str_;
        auto first_line = func_name->names_[0].line_;

        if (!has_member)
        {
            assert(func_name->names_.size() == 1);
            Instruction instruction;
            if (func_name->scoping_ == LexicalScoping_Global)
            {
                // Define a global function
                auto index = function->AddConstString(first_name);
                instruction = Instruction::ABxCode(OpType_SetGlobal, func_register, index);
            }
            else if (func_name->scoping_ == LexicalScoping_Upvalue)
            {
                // Change a upvalue to a function
                auto index = PrepareUpvalue(first_name);
                instruction = Instruction::ABCode(OpType_SetUpvalue, func_register, index);
            }
            else if (func_name->scoping_ == LexicalScoping_Local)
            {
                // Change a local variable to a function
                auto local_name = SearchLocalName(first_name);
                instruction = Instruction::ABCode(OpType_Move, local_name->register_id_,
                                                  func_register);
            }
            function->AddInstruction(instruction, first_line);
        }
        else
        {
            Instruction instruction;
            auto table_register = GenerateRegisterId();
            if (func_name->scoping_ == LexicalScoping_Global)
            {
                // Load global variable to table register
                auto index = function->AddConstString(first_name);
                instruction = Instruction::ABxCode(OpType_GetGlobal,
                                                   table_register, index);
            }
            else if (func_name->scoping_ == LexicalScoping_Upvalue)
            {
                // Load upvalue to table register
                auto index = PrepareUpvalue(first_name);
                instruction = Instruction::ABCode(OpType_GetUpvalue, table_register, index);
            }
            else if (func_name->scoping_ == LexicalScoping_Local)
            {
                // Load local variable to table register
                auto local_name = SearchLocalName(first_name);
                instruction = Instruction::ABCode(OpType_Move, table_register,
                                                  local_name->register_id_);
            }
            function->AddInstruction(instruction, first_line);

            bool member = func_name->member_name_.token_ == Token_Id;
            auto size = func_name->names_.size();
            auto count = member ? size : size - 1;
            auto key_register = GenerateRegisterId();

            auto load_key = [=](String *name, int line) {
                auto index = function->AddConstString(name);
                auto instruction = Instruction::ABxCode(OpType_LoadConst, key_register, index);
                function->AddInstruction(instruction, line);
            };

            for (std::size_t i = 1; i < count; ++i)
            {
                // Get value from table by key
                auto name = func_name->names_[i].str_;
                auto line = func_name->names_[i].line_;
                load_key(name, line);
                instruction = Instruction::ABCCode(OpType_GetTable, table_register,
                                                   key_register, table_register);
                function->AddInstruction(instruction, line);
            }

            // Set function as value of table by key 'token'
            const auto &token = member ? func_name->member_name_ : func_name->names_.back();
            load_key(token.str_, token.line_);
            instruction = Instruction::ABCCode(OpType_SetTable, table_register,
                                               key_register, func_register);
            function->AddInstruction(instruction, token.line_);
        }
    }